

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

Box2i anon_unknown.dwarf_1a47d9::writefile(Schema *scheme,FrameBuffer *buf,bool tiny)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Box2i *pBVar4;
  Compression *pCVar5;
  char *__filename;
  OutputFile *this;
  byte in_CL;
  Vec2<int> extraout_RDX;
  long in_RSI;
  Vec2<int> in_RDI;
  Box2i BVar6;
  int in_stack_0000004c;
  OutputFile *in_stack_00000050;
  OutputFile f;
  FrameBuffer dummy2;
  FrameBuffer dummy1;
  Header hdr;
  int width;
  int height;
  FrameBuffer *in_stack_00000358;
  OutputFile *in_stack_00000360;
  Box<Imath_2_5::Vec2<int>_> *pBVar7;
  undefined8 in_stack_fffffffffffffda0;
  Schema *this_00;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffdb4;
  StringVector *in_stack_fffffffffffffdd8;
  Header *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined8 in_stack_fffffffffffffdf0;
  float pixelAspectRatio;
  undefined8 in_stack_fffffffffffffdf8;
  Schema *this_01;
  Header *in_stack_fffffffffffffe00;
  Schema local_d8;
  Box<Imath_2_5::Vec2<int>_> local_a8 [3];
  undefined1 in_stack_ffffffffffffff97;
  Vec2<float> in_stack_ffffffffffffff98;
  PixelType *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Header *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  OutputFile *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar9;
  int banks;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  pixelAspectRatio = (float)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  banks = 0x80;
  uVar9 = 0x80;
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffff98,0.0,0.0);
  Imf_2_5::Header::Header
            (in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             (int)in_stack_fffffffffffffdf8,pixelAspectRatio,
             (V2f *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (float)((ulong)in_stack_fffffffffffffde0 >> 0x20),(LineOrder)in_stack_fffffffffffffde0,
             (Compression)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  iVar1 = random_int(iVar3);
  pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5bdf);
  (pBVar4->min).x = iVar1 + -100;
  iVar1 = random_int(iVar3);
  pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5c2b);
  (pBVar4->min).y = iVar1 + -100;
  if ((in_CL & 1) == 0) {
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5d7b);
    iVar1 = (pBVar4->min).x;
    iVar2 = random_int(iVar3);
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5dd0);
    (pBVar4->max).x = iVar1 + 0x40 + iVar2;
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5df9);
    iVar1 = (pBVar4->min).y;
    iVar3 = random_int(iVar3);
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5e4c);
    (pBVar4->max).y = iVar1 + 0x40 + iVar3;
  }
  else {
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5c62);
    iVar1 = (pBVar4->min).x;
    iVar2 = random_int(iVar3);
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5cb6);
    (pBVar4->max).x = iVar1 + 1 + iVar2;
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5cdf);
    iVar1 = (pBVar4->min).y;
    iVar3 = random_int(iVar3);
    pBVar4 = Imf_2_5::Header::dataWindow((Header *)0x1e5d34);
    (pBVar4->max).y = iVar1 + 1 + iVar3;
  }
  pCVar5 = Imf_2_5::Header::compression((Header *)0x1e5e72);
  *pCVar5 = ZIPS_COMPRESSION;
  pBVar7 = local_a8;
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e5e96);
  this_00 = &local_d8;
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e5ea8);
  uVar8 = 1;
  this_01 = this_00;
  setupBuffer((Header *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
              in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
              (FrameBuffer *)in_stack_ffffffffffffff98,(FrameBuffer *)in_stack_ffffffffffffffd0,
              (FrameBuffer *)CONCAT44(uVar9,in_stack_ffffffffffffffd8),banks,
              (bool)in_stack_ffffffffffffff97);
  Imf_2_5::Header::channels((Header *)0x1e5f0b);
  Imf_2_5::ChannelList::operator=((ChannelList *)this_00,(ChannelList *)pBVar7);
  Imf_2_5::ChannelList::~ChannelList((ChannelList *)0x1e5f31);
  if (*(long *)(in_RSI + 0x20) != 0) {
    (anonymous_namespace)::Schema::views_abi_cxx11_(this_01);
    Imf_2_5::addMultiView(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdb4,uVar8));
  }
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  this = (OutputFile *)std::__cxx11::string::c_str();
  Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  Imf_2_5::OutputFile::setFrameBuffer(in_stack_00000360,in_stack_00000358);
  Imf_2_5::Header::dataWindow((Header *)0x1e605d);
  Imf_2_5::Header::dataWindow((Header *)0x1e607d);
  Imf_2_5::OutputFile::writePixels(in_stack_00000050,in_stack_0000004c);
  Imf_2_5::Header::dataWindow((Header *)0x1e60b0);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box((Box<Imath_2_5::Vec2<int>_> *)this_00,pBVar7);
  Imf_2_5::OutputFile::~OutputFile(this);
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e60e5);
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e60f2);
  Imf_2_5::Header::~Header((Header *)CONCAT44(in_stack_fffffffffffffdb4,uVar8));
  BVar6.max = extraout_RDX;
  BVar6.min = in_RDI;
  return BVar6;
}

Assistant:

Box2i writefile(Schema & scheme,FrameBuffer& buf,bool tiny)
{
    const int height = 128;
    const int width  = 128;

    Header hdr(width,height,1);
    
    
    //min values in range [-100,100]
    hdr.dataWindow().min.x = random_int(201)-100;
    hdr.dataWindow().min.y = random_int(201)-100;
    
    
    // in tiny mode, make image up to 14*14 pixels (less than two SSE instructions)
    if (tiny)
    {
        hdr.dataWindow().max.x = hdr.dataWindow().min.x + 1 + random_int(14);
        hdr.dataWindow().max.y = hdr.dataWindow().min.y + 1 + random_int(14);
    }
    else
    {
        // in normal mode, make chunky images
        hdr.dataWindow().max.x = hdr.dataWindow().min.x + 64 + random_int(400);
        hdr.dataWindow().max.y = hdr.dataWindow().min.y + 64 + random_int(400);
    }
    
    hdr.compression()=ZIPS_COMPRESSION;
    
    FrameBuffer dummy1,dummy2;
    
    hdr.channels() = setupBuffer (hdr,
                                  scheme._active,
                                  scheme._passive,
                                  scheme._types,
                                  buf,
                                  dummy1,
                                  dummy2,
                                  scheme._banks,
                                  true);
    
    if (scheme._views)
    {
        addMultiView(hdr,scheme.views());
    }
    
    remove (filename.c_str());
    OutputFile f(filename.c_str(), hdr);
    f.setFrameBuffer(buf);
    f.writePixels(hdr.dataWindow().max.y-hdr.dataWindow().min.y+1);

    return hdr.dataWindow();
}